

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O2

Aig_Man_t * Dar_ManRwsat(Aig_Man_t *pAig,int fBalance,int fVerbose)

{
  long lVar1;
  Aig_Man_t *pAVar2;
  Aig_Man_t *p;
  abctime aVar3;
  Dar_RwrPar_t ParsRwr;
  Dar_RefPar_t ParsRef;
  Dar_RwrPar_t local_74;
  Dar_RefPar_t local_50;
  
  lVar1 = pAig->Time2Quit;
  Dar_ManDefaultRwrParams(&local_74);
  Dar_ManDefaultRefParams(&local_50);
  local_74.fUpdateLevel = 0;
  local_50.fUpdateLevel = 0;
  local_74.fVerbose = fVerbose;
  local_50.fVerbose = fVerbose;
  pAVar2 = Aig_ManDupDfs(pAig);
  if (fVerbose != 0) {
    printf("Starting:  ");
    Aig_ManPrintStats(pAVar2);
  }
  p = pAVar2;
  if (fBalance != 0) {
    pAVar2->Time2Quit = lVar1;
    p = Dar_ManBalance(pAVar2,0);
    Aig_ManStop(pAVar2);
    if (fVerbose != 0) {
      printf("Balance:   ");
      Aig_ManPrintStats(p);
    }
    if ((lVar1 != 0) && (aVar3 = Abc_Clock(), lVar1 < aVar3)) goto joined_r0x00426400;
  }
  p->Time2Quit = lVar1;
  Dar_ManRewrite(p,&local_74);
  pAVar2 = Aig_ManDupDfs(p);
  Aig_ManStop(p);
  if (fVerbose != 0) {
    printf("Rewrite:   ");
    Aig_ManPrintStats(pAVar2);
  }
  if ((lVar1 == 0) || (aVar3 = Abc_Clock(), p = pAVar2, aVar3 <= lVar1)) {
    pAVar2->Time2Quit = lVar1;
    Dar_ManRefactor(pAVar2,&local_50);
    p = Aig_ManDupDfs(pAVar2);
    Aig_ManStop(pAVar2);
    if (fVerbose != 0) {
      printf("Refactor:  ");
      Aig_ManPrintStats(p);
    }
    if ((lVar1 == 0) || (aVar3 = Abc_Clock(), aVar3 <= lVar1)) {
      pAVar2 = p;
      if (fBalance != 0) {
        p->Time2Quit = lVar1;
        pAVar2 = Dar_ManBalance(p,0);
        Aig_ManStop(p);
        if (fVerbose != 0) {
          printf("Balance:   ");
          Aig_ManPrintStats(pAVar2);
        }
        if ((lVar1 != 0) && (aVar3 = Abc_Clock(), p = pAVar2, lVar1 < aVar3))
        goto joined_r0x00426400;
      }
      pAVar2->Time2Quit = lVar1;
      Dar_ManRewrite(pAVar2,&local_74);
      p = Aig_ManDupDfs(pAVar2);
      Aig_ManStop(pAVar2);
      if (fVerbose != 0) {
        printf("Rewrite:   ");
        Aig_ManPrintStats(p);
      }
      if (lVar1 == 0) {
        return p;
      }
      aVar3 = Abc_Clock();
      if (aVar3 <= lVar1) {
        return p;
      }
    }
  }
joined_r0x00426400:
  if (p != (Aig_Man_t *)0x0) {
    Aig_ManStop(p);
  }
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Dar_ManRwsat( Aig_Man_t * pAig, int fBalance, int fVerbose )
//alias rwsat       "st; rw -l; b -l; rw -l; rf -l"
{
    Aig_Man_t * pTemp;
    abctime Time = pAig->Time2Quit;

    Dar_RwrPar_t ParsRwr, * pParsRwr = &ParsRwr;
    Dar_RefPar_t ParsRef, * pParsRef = &ParsRef;

    Dar_ManDefaultRwrParams( pParsRwr );
    Dar_ManDefaultRefParams( pParsRef );

    pParsRwr->fUpdateLevel = 0;
    pParsRef->fUpdateLevel = 0;

    pParsRwr->fVerbose = fVerbose;
    pParsRef->fVerbose = fVerbose;
//printf( "1" );
    pAig = Aig_ManDupDfs( pAig ); 
    if ( fVerbose ) printf( "Starting:  " ), Aig_ManPrintStats( pAig );

//printf( "2" );
    // balance
    if ( fBalance )
    {
    pAig->Time2Quit = Time;
    pAig = Dar_ManBalance( pTemp = pAig, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }
    }
   
//Aig_ManDumpBlif( pAig, "inter.blif", NULL, NULL );
//printf( "3" );
    // rewrite
    pAig->Time2Quit = Time;
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "4" );
    // refactor
    pAig->Time2Quit = Time;
    Dar_ManRefactor( pAig, pParsRef );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Refactor:  " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "5" );
    // balance
    if ( fBalance )
    {
    pAig->Time2Quit = Time;
    pAig = Dar_ManBalance( pTemp = pAig, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Balance:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }
    }

//printf( "6" );
    // rewrite
    pAig->Time2Quit = Time;
    Dar_ManRewrite( pAig, pParsRwr );
    pAig = Aig_ManDupDfs( pTemp = pAig ); 
    Aig_ManStop( pTemp );
    if ( fVerbose ) printf( "Rewrite:   " ), Aig_ManPrintStats( pAig );
    if ( Time && Abc_Clock() > Time )
        { if ( pAig ) Aig_ManStop( pAig ); return NULL; }

//printf( "7" );
    return pAig;
}